

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O2

void __thiscall soul::ASTVisitor::visitObject(ASTVisitor *this,ModuleBase *t)

{
  ObjectType OVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  allocator<char> local_29;
  string local_28;
  
  OVar1 = (t->super_ASTObject).objectType;
  if (OVar1 == Namespace) {
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[8];
  }
  else if (OVar1 == Processor) {
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[6];
  }
  else {
    if (OVar1 != Graph) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_28,"Unknown AST module",&local_29);
      throwInternalCompilerError(&local_28);
    }
    UNRECOVERED_JUMPTABLE = this->_vptr_ASTVisitor[7];
  }
  (*UNRECOVERED_JUMPTABLE)();
  return;
}

Assistant:

virtual void visitObject (AST::ModuleBase& t)
    {
        switch (t.objectType)
        {
            SOUL_AST_MODULES (SOUL_INVOKE_FOR_SUBCLASS)
            default: throwInternalCompilerError ("Unknown AST module"); break;
        }
    }